

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIterator.cpp
# Opt level: O0

OnDiskIterator * OnDiskIterator::load(DatabaseName *name)

{
  unsigned_long last_read_time;
  OnDiskIterator *this;
  DatabaseName *name_00;
  DatabaseName *datafile_name_00;
  reference file_offset_00;
  EVP_PKEY_CTX *in_RSI;
  OnDiskIterator *in_RDI;
  uint64_t last_read_timestamp;
  DatabaseName datafile_name;
  uint64_t total_files;
  uint64_t file_offset;
  uint64_t byte_offset;
  json j;
  ifstream in;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  openmode in_stack_fffffffffffffc04;
  path *in_stack_fffffffffffffc08;
  basic_ifstream<char,_std::char_traits<char>_> *in_stack_fffffffffffffc10;
  allocator<char> *total_files_00;
  string local_378 [39];
  allocator<char> local_351;
  string local_350 [8];
  char *in_stack_fffffffffffffcb8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffcc0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  undefined1 local_218 [520];
  EVP_PKEY_CTX *local_10;
  
  local_10 = in_RSI;
  DatabaseName::get_full_path_abi_cxx11_(&in_RDI->name);
  std::ifstream::
  ifstream<std::experimental::filesystem::v1::__cxx11::path,std::experimental::filesystem::v1::__cxx11::path>
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
  std::experimental::filesystem::v1::__cxx11::path::~path
            ((path *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8);
  nlohmann::operator>>((istream *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  last_read_time =
       nlohmann::
       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
       ::operator_unsigned_long<unsigned_long,_0>
                 ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)0x1b7709);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  this = (OnDiskIterator *)
         nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::operator_unsigned_long<unsigned_long,_0>
                   ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)0x1b7742);
  name_00 = (DatabaseName *)
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  datafile_name_00 =
       (DatabaseName *)
       nlohmann::
       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
       ::operator_unsigned_long<unsigned_long,_0>
                 ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)0x1b777b);
  total_files_00 = &local_351;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)name_00,(allocator<char> *)datafile_name_00);
  file_offset_00 =
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::operator[]<char_const>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (in_stack_fffffffffffffbf8);
  DatabaseName::derive
            ((DatabaseName *)&stack0xfffffffffffffcd0,local_10,(uchar *)local_350,
             (size_t *)local_378);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator(&local_351);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator_unsigned_long<unsigned_long,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)0x1b7868);
  OnDiskIterator(this,name_00,datafile_name_00,(uint64_t)total_files_00,(uint64_t)local_10,
                 (uint64_t)file_offset_00,last_read_time);
  DatabaseName::~DatabaseName
            ((DatabaseName *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  std::ifstream::~ifstream(local_218);
  return in_RDI;
}

Assistant:

OnDiskIterator OnDiskIterator::load(const DatabaseName &name) {
    std::ifstream in(name.get_full_path(), std::ifstream::binary);
    json j;
    in >> j;

    uint64_t byte_offset = j["byte_offset"];
    uint64_t file_offset = j["file_offset"];
    uint64_t total_files = j["total_files"];
    auto datafile_name = name.derive("iterator", j["backing_storage"]);
    uint64_t last_read_timestamp = j["last_read_timestamp"];

    return OnDiskIterator(name, datafile_name, total_files, byte_offset,
                          file_offset, last_read_timestamp);
}